

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

string * cfgfile::generator::generate_class_name(string *name)

{
  string *psVar1;
  string *in_RSI;
  string *in_RDI;
  size_type pos;
  string *res;
  string local_50 [55];
  undefined1 local_19;
  long local_18;
  string *local_10;
  
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::rfind(in_RSI,0x189910);
  psVar1 = local_10;
  local_19 = 0;
  if (local_18 == -1) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)psVar1);
  }
  std::__cxx11::string::append((char *)in_RDI);
  if (local_18 == -1) {
    std::__cxx11::string::string(local_50,local_10);
  }
  else {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_10);
  }
  std::__cxx11::string::append(in_RDI);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

static inline std::string generate_class_name( const std::string & name )
{
	const auto pos = name.rfind( cfg::c_namespace_separator );

	std::string res = ( pos == std::string::npos ? std::string() :
		name.substr( 0, pos + cfg::c_namespace_separator.length() ) );
	res.append( "tag_" );
	res.append( ( pos == std::string::npos ? name :
		name.substr( pos + cfg::c_namespace_separator.length() ) ) );

	return res;
}